

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDDMR::processSyncOrSkip(DSDDMR *this)

{
  uint uVar1;
  DSDDMRSlot DVar2;
  DSDDecoder *pDVar3;
  bool bVar4;
  DSDFSMState DVar5;
  int iVar6;
  ulong uVar7;
  SyncPattern patterns [2];
  DSDSync syncEngine;
  SyncPattern local_88 [3];
  DSDSync local_7c;
  
  local_88[0] = SyncDMRDataBS;
  local_88[1] = SyncDMRVoiceBS;
  iVar6 = this->m_symbolIndex;
  if (iVar6 < 0x19) {
LAB_00113005:
    iVar6 = iVar6 + 1;
LAB_00113007:
    this->m_symbolIndex = iVar6;
    this->m_cachSymbolIndex = this->m_cachSymbolIndex + 1;
  }
  else {
    pDVar3 = this->m_dsdDecoder;
    uVar1 = (pDVar3->m_dsdSymbol).m_syncSymbolBuffer.m_size;
    iVar6 = (pDVar3->m_dsdSymbol).m_syncSymbolBuffer.m_index;
    uVar7 = (ulong)iVar6;
    if (0x18 < uVar1) {
      uVar7 = (ulong)((uVar1 + iVar6) - 0x18) % (ulong)uVar1;
    }
    DSDSync::matchSome(&local_7c,(pDVar3->m_dsdSymbol).m_syncSymbolBuffer.m_buffer + uVar7,0x18,
                       local_88,2);
    bVar4 = DSDSync::isMatching(&local_7c,SyncDMRDataBS);
    if (bVar4) {
      processDataFirstHalf(this,0x5a);
      DVar5 = DSDprocessDMRdata;
    }
    else {
      bVar4 = DSDSync::isMatching(&local_7c,SyncDMRVoiceBS);
      if (!bVar4) {
        iVar6 = this->m_symbolIndex;
        if (iVar6 != 0x8f) goto LAB_00113005;
        DVar2 = this->m_slot;
        this->m_slot = (DVar2 - ((DVar2 - ((int)(DVar2 + DSDDMRSlot2) >> 0x1f)) + 1 & 0xfffffffe)) +
                       DSDDMRSlot2;
        this->m_continuation = true;
        this->m_dsdDecoder->m_fsmState = DSDprocessDMRvoice;
        iVar6 = 0;
        goto LAB_00113007;
      }
      processVoiceFirstHalf(this,0x5a);
      DVar5 = DSDprocessDMRvoice;
    }
    this->m_dsdDecoder->m_fsmState = DVar5;
  }
  return;
}

Assistant:

void DSDDMR::processSyncOrSkip()
{
    const int sync_db_size = IN_DIBITS(DMR_SYNC_LEN);
    const DSDSync::SyncPattern patterns[2] = { DSDSync::SyncDMRDataBS, DSDSync::SyncDMRVoiceBS };

    if (m_symbolIndex > sync_db_size) // accumulate enough symbols to look for a sync
    {
        DSDSync syncEngine;
        syncEngine.matchSome(m_dsdDecoder->m_dsdSymbol.getSyncDibitBack(sync_db_size), sync_db_size, patterns, 2);

        if (syncEngine.isMatching(DSDSync::SyncDMRDataBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: data sync" << std::endl;
            processDataFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRdata;
            return;
        }
        else if (syncEngine.isMatching(DSDSync::SyncDMRVoiceBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: voice sync" << std::endl;
            processVoiceFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
            return;
        }
    }

    if (m_symbolIndex == IN_DIBITS(DMR_TS_LEN) - 1) // last dibit
    {
        // return to voice super frame
        m_slot = (DSDDMRSlot) (((int) m_slot + 1) % 2); // to keep the slot in the next slot period fake a slot reversal
        m_continuation = true;
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
        m_symbolIndex = 0;
    }
    else
    {
        m_symbolIndex++;
    }

    m_cachSymbolIndex++; // last dibit counts
}